

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float fVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  Geometry *pGVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  uint uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  Scene *pSVar27;
  ulong uVar28;
  ulong *puVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  float fVar39;
  float fVar40;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar41;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar52;
  float fVar58;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar59;
  float fVar60;
  undefined1 auVar57 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar72;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  float fVar73;
  float fVar74;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar75 [16];
  float fVar83;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar84;
  undefined1 auVar78 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [64];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [64];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [64];
  float fVar102;
  undefined1 auVar103 [16];
  float fVar110;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar108;
  float fVar109;
  undefined1 auVar107 [64];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [64];
  float fVar115;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar116 [64];
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar121 [64];
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar126 [64];
  float fVar130;
  undefined1 auVar131 [16];
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar132 [64];
  float fVar136;
  float fVar137;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar138 [16];
  float fVar144;
  undefined1 auVar139 [16];
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  UVIdentity<4> mapUV;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_157d;
  int local_157c;
  undefined8 local_1578;
  float fStack_1570;
  float fStack_156c;
  undefined8 local_1568;
  float fStack_1560;
  float fStack_155c;
  undefined8 local_1558;
  float fStack_1550;
  float fStack_154c;
  RayQueryContext *local_1540;
  undefined1 local_1538 [16];
  undefined1 local_1528 [16];
  undefined1 local_1518 [16];
  undefined1 local_1508 [16];
  undefined1 local_14f8 [16];
  ulong *local_14e0;
  long local_14d8;
  long local_14d0;
  undefined4 local_14c8;
  undefined4 local_14c4;
  undefined4 local_14c0;
  undefined4 local_14bc;
  undefined4 local_14b8;
  undefined4 local_14b4;
  uint local_14b0;
  uint local_14ac;
  uint local_14a8;
  RTCFilterFunctionNArguments local_1498;
  undefined1 local_1468 [16];
  undefined1 local_1458 [16];
  undefined1 local_1448 [16];
  undefined1 local_1438 [16];
  undefined1 local_1428 [16];
  undefined1 local_1418 [16];
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  undefined1 local_13c8 [16];
  undefined1 *local_13b8;
  undefined1 local_13a8 [16];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [32];
  undefined1 local_1318 [32];
  undefined1 local_12f8 [32];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8 [565];
  
  local_11d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8[0] != 8) {
    fVar2 = ray->tfar;
    if (0.0 <= fVar2) {
      puVar29 = local_11d8 + 1;
      aVar4 = (ray->dir).field_0;
      auVar42 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar70._8_4_ = 0x7fffffff;
      auVar70._0_8_ = 0x7fffffff7fffffff;
      auVar70._12_4_ = 0x7fffffff;
      auVar70 = vandps_avx((undefined1  [16])aVar4,auVar70);
      auVar85._8_4_ = 0x219392ef;
      auVar85._0_8_ = 0x219392ef219392ef;
      auVar85._12_4_ = 0x219392ef;
      auVar70 = vcmpps_avx(auVar70,auVar85,1);
      auVar86._8_4_ = 0x3f800000;
      auVar86._0_8_ = 0x3f8000003f800000;
      auVar86._12_4_ = 0x3f800000;
      auVar85 = vdivps_avx(auVar86,(undefined1  [16])aVar4);
      auVar87._8_4_ = 0x5d5e0b6b;
      auVar87._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar87._12_4_ = 0x5d5e0b6b;
      auVar70 = vblendvps_avx(auVar85,auVar87,auVar70);
      auVar75._0_4_ = auVar70._0_4_ * 0.99999964;
      auVar75._4_4_ = auVar70._4_4_ * 0.99999964;
      auVar75._8_4_ = auVar70._8_4_ * 0.99999964;
      auVar75._12_4_ = auVar70._12_4_ * 0.99999964;
      uVar3 = *(undefined4 *)&(ray->org).field_0;
      local_11f8._4_4_ = uVar3;
      local_11f8._0_4_ = uVar3;
      local_11f8._8_4_ = uVar3;
      local_11f8._12_4_ = uVar3;
      local_11f8._16_4_ = uVar3;
      local_11f8._20_4_ = uVar3;
      local_11f8._24_4_ = uVar3;
      local_11f8._28_4_ = uVar3;
      auVar101 = ZEXT3264(local_11f8);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1218._4_4_ = uVar3;
      local_1218._0_4_ = uVar3;
      local_1218._8_4_ = uVar3;
      local_1218._12_4_ = uVar3;
      local_1218._16_4_ = uVar3;
      local_1218._20_4_ = uVar3;
      local_1218._24_4_ = uVar3;
      local_1218._28_4_ = uVar3;
      auVar107 = ZEXT3264(local_1218);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1238._4_4_ = uVar3;
      local_1238._0_4_ = uVar3;
      local_1238._8_4_ = uVar3;
      local_1238._12_4_ = uVar3;
      local_1238._16_4_ = uVar3;
      local_1238._20_4_ = uVar3;
      local_1238._24_4_ = uVar3;
      local_1238._28_4_ = uVar3;
      auVar114 = ZEXT3264(local_1238);
      auVar61._0_4_ = auVar70._0_4_ * 1.0000004;
      auVar61._4_4_ = auVar70._4_4_ * 1.0000004;
      auVar61._8_4_ = auVar70._8_4_ * 1.0000004;
      auVar61._12_4_ = auVar70._12_4_ * 1.0000004;
      auVar70 = vshufps_avx(auVar75,auVar75,0);
      local_1258._16_16_ = auVar70;
      local_1258._0_16_ = auVar70;
      auVar116 = ZEXT3264(local_1258);
      auVar70 = vmovshdup_avx(auVar75);
      auVar85 = vshufps_avx(auVar75,auVar75,0x55);
      local_1278._16_16_ = auVar85;
      local_1278._0_16_ = auVar85;
      auVar121 = ZEXT3264(local_1278);
      auVar85 = vshufpd_avx(auVar75,auVar75,1);
      auVar86 = vshufps_avx(auVar75,auVar75,0xaa);
      local_1298._16_16_ = auVar86;
      local_1298._0_16_ = auVar86;
      auVar126 = ZEXT3264(local_1298);
      auVar86 = vshufps_avx(auVar61,auVar61,0);
      local_12b8._16_16_ = auVar86;
      local_12b8._0_16_ = auVar86;
      auVar132 = ZEXT3264(local_12b8);
      uVar30 = (ulong)(auVar75._0_4_ < 0.0) << 5;
      auVar86 = vshufps_avx(auVar61,auVar61,0x55);
      local_12d8._16_16_ = auVar86;
      local_12d8._0_16_ = auVar86;
      auVar78 = ZEXT3264(local_12d8);
      auVar86 = vshufps_avx(auVar61,auVar61,0xaa);
      uVar31 = (ulong)(auVar70._0_4_ < 0.0) << 5 | 0x40;
      local_12f8._16_16_ = auVar86;
      local_12f8._0_16_ = auVar86;
      auVar71 = ZEXT3264(local_12f8);
      uVar28 = (ulong)(auVar85._0_4_ < 0.0) << 5 | 0x80;
      uVar32 = uVar30 ^ 0x20;
      auVar70 = vshufps_avx(auVar42,auVar42,0);
      local_1318._16_16_ = auVar70;
      local_1318._0_16_ = auVar70;
      auVar91 = ZEXT3264(local_1318);
      auVar70 = vshufps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),0);
      local_1338._16_16_ = auVar70;
      local_1338._0_16_ = auVar70;
      auVar95 = ZEXT3264(local_1338);
      local_1468 = mm_lookupmask_ps._240_16_;
      local_1540 = context;
LAB_00e58d5f:
      if (puVar29 != local_11d8) {
        uVar33 = puVar29[-1];
        puVar29 = puVar29 + -1;
        while ((uVar33 & 8) == 0) {
          auVar16 = vsubps_avx(*(undefined1 (*) [32])(uVar33 + 0x40 + uVar30),auVar101._0_32_);
          auVar17._4_4_ = auVar116._4_4_ * auVar16._4_4_;
          auVar17._0_4_ = auVar116._0_4_ * auVar16._0_4_;
          auVar17._8_4_ = auVar116._8_4_ * auVar16._8_4_;
          auVar17._12_4_ = auVar116._12_4_ * auVar16._12_4_;
          auVar17._16_4_ = auVar116._16_4_ * auVar16._16_4_;
          auVar17._20_4_ = auVar116._20_4_ * auVar16._20_4_;
          auVar17._24_4_ = auVar116._24_4_ * auVar16._24_4_;
          auVar17._28_4_ = auVar16._28_4_;
          auVar16 = vsubps_avx(*(undefined1 (*) [32])(uVar33 + 0x40 + uVar31),auVar107._0_32_);
          auVar18._4_4_ = auVar121._4_4_ * auVar16._4_4_;
          auVar18._0_4_ = auVar121._0_4_ * auVar16._0_4_;
          auVar18._8_4_ = auVar121._8_4_ * auVar16._8_4_;
          auVar18._12_4_ = auVar121._12_4_ * auVar16._12_4_;
          auVar18._16_4_ = auVar121._16_4_ * auVar16._16_4_;
          auVar18._20_4_ = auVar121._20_4_ * auVar16._20_4_;
          auVar18._24_4_ = auVar121._24_4_ * auVar16._24_4_;
          auVar18._28_4_ = auVar16._28_4_;
          auVar16 = vmaxps_avx(auVar17,auVar18);
          auVar17 = vsubps_avx(*(undefined1 (*) [32])(uVar33 + 0x40 + uVar28),auVar114._0_32_);
          auVar19._4_4_ = auVar126._4_4_ * auVar17._4_4_;
          auVar19._0_4_ = auVar126._0_4_ * auVar17._0_4_;
          auVar19._8_4_ = auVar126._8_4_ * auVar17._8_4_;
          auVar19._12_4_ = auVar126._12_4_ * auVar17._12_4_;
          auVar19._16_4_ = auVar126._16_4_ * auVar17._16_4_;
          auVar19._20_4_ = auVar126._20_4_ * auVar17._20_4_;
          auVar19._24_4_ = auVar126._24_4_ * auVar17._24_4_;
          auVar19._28_4_ = auVar17._28_4_;
          auVar17 = vmaxps_avx(auVar19,auVar91._0_32_);
          auVar16 = vmaxps_avx(auVar16,auVar17);
          auVar17 = vsubps_avx(*(undefined1 (*) [32])(uVar33 + 0x40 + uVar32),auVar101._0_32_);
          auVar20._4_4_ = auVar132._4_4_ * auVar17._4_4_;
          auVar20._0_4_ = auVar132._0_4_ * auVar17._0_4_;
          auVar20._8_4_ = auVar132._8_4_ * auVar17._8_4_;
          auVar20._12_4_ = auVar132._12_4_ * auVar17._12_4_;
          auVar20._16_4_ = auVar132._16_4_ * auVar17._16_4_;
          auVar20._20_4_ = auVar132._20_4_ * auVar17._20_4_;
          auVar20._24_4_ = auVar132._24_4_ * auVar17._24_4_;
          auVar20._28_4_ = auVar17._28_4_;
          auVar17 = vsubps_avx(*(undefined1 (*) [32])(uVar33 + 0x40 + (uVar31 ^ 0x20)),
                               auVar107._0_32_);
          auVar21._4_4_ = auVar78._4_4_ * auVar17._4_4_;
          auVar21._0_4_ = auVar78._0_4_ * auVar17._0_4_;
          auVar21._8_4_ = auVar78._8_4_ * auVar17._8_4_;
          auVar21._12_4_ = auVar78._12_4_ * auVar17._12_4_;
          auVar21._16_4_ = auVar78._16_4_ * auVar17._16_4_;
          auVar21._20_4_ = auVar78._20_4_ * auVar17._20_4_;
          auVar21._24_4_ = auVar78._24_4_ * auVar17._24_4_;
          auVar21._28_4_ = auVar17._28_4_;
          auVar17 = vminps_avx(auVar20,auVar21);
          auVar18 = vsubps_avx(*(undefined1 (*) [32])(uVar33 + 0x40 + (uVar28 ^ 0x20)),
                               auVar114._0_32_);
          auVar22._4_4_ = auVar71._4_4_ * auVar18._4_4_;
          auVar22._0_4_ = auVar71._0_4_ * auVar18._0_4_;
          auVar22._8_4_ = auVar71._8_4_ * auVar18._8_4_;
          auVar22._12_4_ = auVar71._12_4_ * auVar18._12_4_;
          auVar22._16_4_ = auVar71._16_4_ * auVar18._16_4_;
          auVar22._20_4_ = auVar71._20_4_ * auVar18._20_4_;
          auVar22._24_4_ = auVar71._24_4_ * auVar18._24_4_;
          auVar22._28_4_ = auVar18._28_4_;
          auVar18 = vminps_avx(auVar22,auVar95._0_32_);
          auVar17 = vminps_avx(auVar17,auVar18);
          auVar16 = vcmpps_avx(auVar16,auVar17,2);
          uVar23 = vmovmskps_avx(auVar16);
          if (uVar23 == 0) goto LAB_00e58d5f;
          uVar23 = uVar23 & 0xff;
          uVar24 = uVar33 & 0xfffffffffffffff0;
          lVar25 = 0;
          if (uVar23 != 0) {
            for (; (uVar23 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
            }
          }
          uVar33 = *(ulong *)(uVar24 + lVar25 * 8);
          uVar23 = uVar23 - 1 & uVar23;
          uVar26 = (ulong)uVar23;
          if (uVar23 != 0) {
            do {
              *puVar29 = uVar33;
              puVar29 = puVar29 + 1;
              lVar25 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                }
              }
              uVar33 = *(ulong *)(uVar24 + lVar25 * 8);
              uVar26 = uVar26 - 1 & uVar26;
            } while (uVar26 != 0);
          }
        }
        local_14d0 = (ulong)((uint)uVar33 & 0xf) - 8;
        uVar33 = uVar33 & 0xfffffffffffffff0;
        for (local_14d8 = 0; local_14d8 != local_14d0; local_14d8 = local_14d8 + 1) {
          lVar25 = local_14d8 * 0x50;
          pSVar27 = context->scene;
          ppfVar5 = (pSVar27->vertices).items;
          pfVar6 = ppfVar5[*(uint *)(uVar33 + 0x30 + lVar25)];
          pfVar7 = ppfVar5[*(uint *)(uVar33 + 0x34 + lVar25)];
          pfVar8 = ppfVar5[*(uint *)(uVar33 + 0x38 + lVar25)];
          pfVar9 = ppfVar5[*(uint *)(uVar33 + 0x3c + lVar25)];
          auVar42 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar33 + lVar25)),
                                  *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar33 + 8 + lVar25)));
          auVar70 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar33 + lVar25)),
                                  *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar33 + 8 + lVar25)));
          auVar86 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar33 + 4 + lVar25)),
                                  *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar33 + 0xc + lVar25)))
          ;
          auVar85 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar33 + 4 + lVar25)),
                                  *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar33 + 0xc + lVar25)))
          ;
          auVar75 = vunpcklps_avx(auVar70,auVar85);
          auVar87 = vunpcklps_avx(auVar42,auVar86);
          auVar70 = vunpckhps_avx(auVar42,auVar86);
          auVar86 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar33 + 0x10 + lVar25))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar33 + 0x18 + lVar25)));
          auVar85 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar33 + 0x10 + lVar25))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar33 + 0x18 + lVar25)));
          auVar61 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar33 + 0x14 + lVar25))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar33 + 0x1c + lVar25)));
          auVar42 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar33 + 0x14 + lVar25))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar33 + 0x1c + lVar25)));
          auVar43 = vunpcklps_avx(auVar85,auVar42);
          auVar34 = vunpcklps_avx(auVar86,auVar61);
          auVar85 = vunpckhps_avx(auVar86,auVar61);
          auVar61 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar33 + 0x20 + lVar25))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar33 + 0x28 + lVar25)));
          auVar42 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar33 + 0x20 + lVar25))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar33 + 0x28 + lVar25)));
          auVar35 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar33 + 0x24 + lVar25))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar33 + 0x2c + lVar25)));
          auVar86 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar33 + 0x24 + lVar25))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar33 + 0x2c + lVar25)));
          auVar53 = vunpcklps_avx(auVar42,auVar86);
          auVar86 = vunpcklps_avx(auVar61,auVar35);
          auVar61 = vunpckhps_avx(auVar61,auVar35);
          puVar1 = (undefined8 *)(uVar33 + 0x30 + lVar25);
          local_13f8 = *puVar1;
          uStack_13f0 = puVar1[1];
          puVar1 = (undefined8 *)(uVar33 + 0x40 + lVar25);
          local_1408 = *puVar1;
          uStack_1400 = puVar1[1];
          uVar3 = *(undefined4 *)&(ray->org).field_0;
          auVar111._4_4_ = uVar3;
          auVar111._0_4_ = uVar3;
          auVar111._8_4_ = uVar3;
          auVar111._12_4_ = uVar3;
          uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
          auVar131._4_4_ = uVar3;
          auVar131._0_4_ = uVar3;
          auVar131._8_4_ = uVar3;
          auVar131._12_4_ = uVar3;
          uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
          auVar138._4_4_ = uVar3;
          auVar138._0_4_ = uVar3;
          auVar138._8_4_ = uVar3;
          auVar138._12_4_ = uVar3;
          local_14f8 = vsubps_avx(auVar87,auVar111);
          local_1508 = vsubps_avx(auVar70,auVar131);
          local_1518 = vsubps_avx(auVar75,auVar138);
          auVar70 = vsubps_avx(auVar34,auVar111);
          auVar85 = vsubps_avx(auVar85,auVar131);
          auVar42 = vsubps_avx(auVar43,auVar138);
          auVar86 = vsubps_avx(auVar86,auVar111);
          auVar61 = vsubps_avx(auVar61,auVar131);
          auVar75 = vsubps_avx(auVar53,auVar138);
          local_1528 = vsubps_avx(auVar86,local_14f8);
          local_1538 = vsubps_avx(auVar61,local_1508);
          local_1418 = vsubps_avx(auVar75,local_1518);
          fVar2 = local_1508._0_4_;
          fVar41 = auVar61._0_4_ + fVar2;
          fVar12 = local_1508._4_4_;
          fVar49 = auVar61._4_4_ + fVar12;
          fVar59 = local_1508._8_4_;
          fVar50 = auVar61._8_4_ + fVar59;
          fVar14 = local_1508._12_4_;
          fVar51 = auVar61._12_4_ + fVar14;
          fVar115 = local_1518._0_4_;
          fVar73 = fVar115 + auVar75._0_4_;
          fVar117 = local_1518._4_4_;
          fVar79 = fVar117 + auVar75._4_4_;
          fVar118 = local_1518._8_4_;
          fVar81 = fVar118 + auVar75._8_4_;
          fVar119 = local_1518._12_4_;
          fVar83 = fVar119 + auVar75._12_4_;
          fVar52 = local_1418._0_4_;
          auVar103._0_4_ = fVar52 * fVar41;
          fVar58 = local_1418._4_4_;
          auVar103._4_4_ = fVar58 * fVar49;
          fVar39 = local_1418._8_4_;
          auVar103._8_4_ = fVar39 * fVar50;
          fVar40 = local_1418._12_4_;
          auVar103._12_4_ = fVar40 * fVar51;
          fVar146 = local_1538._0_4_;
          auVar112._0_4_ = fVar146 * fVar73;
          fVar147 = local_1538._4_4_;
          auVar112._4_4_ = fVar147 * fVar79;
          fVar148 = local_1538._8_4_;
          auVar112._8_4_ = fVar148 * fVar81;
          fVar149 = local_1538._12_4_;
          auVar112._12_4_ = fVar149 * fVar83;
          auVar87 = vsubps_avx(auVar112,auVar103);
          fVar11 = local_14f8._0_4_;
          fVar102 = auVar86._0_4_ + fVar11;
          fVar13 = local_14f8._4_4_;
          fVar108 = auVar86._4_4_ + fVar13;
          fVar60 = local_14f8._8_4_;
          fVar109 = auVar86._8_4_ + fVar60;
          fVar15 = local_14f8._12_4_;
          fVar110 = auVar86._12_4_ + fVar15;
          fVar136 = local_1528._0_4_;
          auVar76._0_4_ = fVar136 * fVar73;
          fVar140 = local_1528._4_4_;
          auVar76._4_4_ = fVar140 * fVar79;
          fVar142 = local_1528._8_4_;
          auVar76._8_4_ = fVar142 * fVar81;
          fVar144 = local_1528._12_4_;
          auVar76._12_4_ = fVar144 * fVar83;
          auVar113._0_4_ = fVar102 * fVar52;
          auVar113._4_4_ = fVar108 * fVar58;
          auVar113._8_4_ = fVar109 * fVar39;
          auVar113._12_4_ = fVar110 * fVar40;
          auVar43 = vsubps_avx(auVar113,auVar76);
          auVar104._0_4_ = fVar146 * fVar102;
          auVar104._4_4_ = fVar147 * fVar108;
          auVar104._8_4_ = fVar148 * fVar109;
          auVar104._12_4_ = fVar149 * fVar110;
          auVar34._0_4_ = fVar136 * fVar41;
          auVar34._4_4_ = fVar140 * fVar49;
          auVar34._8_4_ = fVar142 * fVar50;
          auVar34._12_4_ = fVar144 * fVar51;
          auVar34 = vsubps_avx(auVar34,auVar104);
          local_1568._4_4_ = (ray->dir).field_0.m128[2];
          local_1578._4_4_ = (ray->dir).field_0.m128[1];
          fStack_1550 = (ray->dir).field_0.m128[0];
          local_1558 = (RTCIntersectArguments *)CONCAT44(fStack_1550,fStack_1550);
          fStack_154c = fStack_1550;
          local_1438._0_4_ =
               auVar87._0_4_ * fStack_1550 +
               local_1578._4_4_ * auVar43._0_4_ + local_1568._4_4_ * auVar34._0_4_;
          local_1438._4_4_ =
               auVar87._4_4_ * fStack_1550 +
               local_1578._4_4_ * auVar43._4_4_ + local_1568._4_4_ * auVar34._4_4_;
          local_1438._8_4_ =
               auVar87._8_4_ * fStack_1550 +
               local_1578._4_4_ * auVar43._8_4_ + local_1568._4_4_ * auVar34._8_4_;
          local_1438._12_4_ =
               auVar87._12_4_ * fStack_1550 +
               local_1578._4_4_ * auVar43._12_4_ + local_1568._4_4_ * auVar34._12_4_;
          local_1428 = vsubps_avx(local_1508,auVar85);
          auVar87 = vsubps_avx(local_1518,auVar42);
          fVar41 = fVar2 + auVar85._0_4_;
          fVar49 = fVar12 + auVar85._4_4_;
          fVar50 = fVar59 + auVar85._8_4_;
          fVar51 = fVar14 + auVar85._12_4_;
          fVar73 = fVar115 + auVar42._0_4_;
          fVar79 = fVar117 + auVar42._4_4_;
          fVar81 = fVar118 + auVar42._8_4_;
          fVar83 = fVar119 + auVar42._12_4_;
          fVar120 = auVar87._0_4_;
          auVar139._0_4_ = fVar120 * fVar41;
          fVar122 = auVar87._4_4_;
          auVar139._4_4_ = fVar122 * fVar49;
          fVar123 = auVar87._8_4_;
          auVar139._8_4_ = fVar123 * fVar50;
          fVar124 = auVar87._12_4_;
          auVar139._12_4_ = fVar124 * fVar51;
          fVar130 = local_1428._0_4_;
          auVar62._0_4_ = fVar130 * fVar73;
          fVar133 = local_1428._4_4_;
          auVar62._4_4_ = fVar133 * fVar79;
          fVar134 = local_1428._8_4_;
          auVar62._8_4_ = fVar134 * fVar81;
          fVar135 = local_1428._12_4_;
          auVar62._12_4_ = fVar135 * fVar83;
          auVar87 = vsubps_avx(auVar62,auVar139);
          auVar43 = vsubps_avx(local_14f8,auVar70);
          fVar137 = auVar43._0_4_;
          auVar77._0_4_ = fVar137 * fVar73;
          fVar141 = auVar43._4_4_;
          auVar77._4_4_ = fVar141 * fVar79;
          fVar143 = auVar43._8_4_;
          auVar77._8_4_ = fVar143 * fVar81;
          fVar145 = auVar43._12_4_;
          auVar77._12_4_ = fVar145 * fVar83;
          fVar73 = fVar11 + auVar70._0_4_;
          fVar79 = fVar13 + auVar70._4_4_;
          fVar81 = fVar60 + auVar70._8_4_;
          fVar83 = fVar15 + auVar70._12_4_;
          auVar105._0_4_ = fVar120 * fVar73;
          auVar105._4_4_ = fVar122 * fVar79;
          auVar105._8_4_ = fVar123 * fVar81;
          auVar105._12_4_ = fVar124 * fVar83;
          auVar43 = vsubps_avx(auVar105,auVar77);
          auVar96._0_4_ = fVar130 * fVar73;
          auVar96._4_4_ = fVar133 * fVar79;
          auVar96._8_4_ = fVar134 * fVar81;
          auVar96._12_4_ = fVar135 * fVar83;
          auVar35._0_4_ = fVar137 * fVar41;
          auVar35._4_4_ = fVar141 * fVar49;
          auVar35._8_4_ = fVar143 * fVar50;
          auVar35._12_4_ = fVar145 * fVar51;
          auVar34 = vsubps_avx(auVar35,auVar96);
          local_13d8._0_4_ =
               fStack_1550 * auVar87._0_4_ +
               local_1578._4_4_ * auVar43._0_4_ + local_1568._4_4_ * auVar34._0_4_;
          local_13d8._4_4_ =
               fStack_1550 * auVar87._4_4_ +
               local_1578._4_4_ * auVar43._4_4_ + local_1568._4_4_ * auVar34._4_4_;
          local_13d8._8_4_ =
               fStack_1550 * auVar87._8_4_ +
               local_1578._4_4_ * auVar43._8_4_ + local_1568._4_4_ * auVar34._8_4_;
          local_13d8._12_4_ =
               fStack_1550 * auVar87._12_4_ +
               local_1578._4_4_ * auVar43._12_4_ + local_1568._4_4_ * auVar34._12_4_;
          auVar87 = vsubps_avx(auVar70,auVar86);
          fVar108 = auVar86._0_4_ + auVar70._0_4_;
          fVar109 = auVar86._4_4_ + auVar70._4_4_;
          fVar110 = auVar86._8_4_ + auVar70._8_4_;
          fVar72 = auVar86._12_4_ + auVar70._12_4_;
          auVar70 = vsubps_avx(auVar85,auVar61);
          fVar79 = auVar85._0_4_ + auVar61._0_4_;
          fVar81 = auVar85._4_4_ + auVar61._4_4_;
          fVar83 = auVar85._8_4_ + auVar61._8_4_;
          fVar102 = auVar85._12_4_ + auVar61._12_4_;
          auVar85 = vsubps_avx(auVar42,auVar75);
          fVar49 = auVar42._0_4_ + auVar75._0_4_;
          fVar50 = auVar42._4_4_ + auVar75._4_4_;
          fVar51 = auVar42._8_4_ + auVar75._8_4_;
          fVar73 = auVar42._12_4_ + auVar75._12_4_;
          fVar74 = auVar85._0_4_;
          auVar88._0_4_ = fVar74 * fVar79;
          fVar80 = auVar85._4_4_;
          auVar88._4_4_ = fVar80 * fVar81;
          fVar82 = auVar85._8_4_;
          auVar88._8_4_ = fVar82 * fVar83;
          fVar84 = auVar85._12_4_;
          auVar88._12_4_ = fVar84 * fVar102;
          fVar125 = auVar70._0_4_;
          auVar97._0_4_ = fVar125 * fVar49;
          fVar127 = auVar70._4_4_;
          auVar97._4_4_ = fVar127 * fVar50;
          fVar128 = auVar70._8_4_;
          auVar97._8_4_ = fVar128 * fVar51;
          fVar129 = auVar70._12_4_;
          auVar97._12_4_ = fVar129 * fVar73;
          auVar70 = vsubps_avx(auVar97,auVar88);
          fVar41 = auVar87._0_4_;
          auVar42._0_4_ = fVar41 * fVar49;
          fVar49 = auVar87._4_4_;
          auVar42._4_4_ = fVar49 * fVar50;
          fVar50 = auVar87._8_4_;
          auVar42._8_4_ = fVar50 * fVar51;
          fVar51 = auVar87._12_4_;
          auVar42._12_4_ = fVar51 * fVar73;
          auVar98._0_4_ = fVar74 * fVar108;
          auVar98._4_4_ = fVar80 * fVar109;
          auVar98._8_4_ = fVar82 * fVar110;
          auVar98._12_4_ = fVar84 * fVar72;
          auVar85 = vsubps_avx(auVar98,auVar42);
          auVar63._0_4_ = fVar125 * fVar108;
          auVar63._4_4_ = fVar127 * fVar109;
          auVar63._8_4_ = fVar128 * fVar110;
          auVar63._12_4_ = fVar129 * fVar72;
          auVar53._0_4_ = fVar41 * fVar79;
          auVar53._4_4_ = fVar49 * fVar81;
          auVar53._8_4_ = fVar50 * fVar83;
          auVar53._12_4_ = fVar51 * fVar102;
          auVar42 = vsubps_avx(auVar53,auVar63);
          local_1568._0_4_ = local_1568._4_4_;
          fStack_1560 = local_1568._4_4_;
          fStack_155c = local_1568._4_4_;
          local_1578._0_4_ = local_1578._4_4_;
          fStack_1570 = local_1578._4_4_;
          fStack_156c = local_1578._4_4_;
          auVar43._0_4_ =
               fStack_1550 * auVar70._0_4_ +
               local_1578._4_4_ * auVar85._0_4_ + local_1568._4_4_ * auVar42._0_4_;
          auVar43._4_4_ =
               fStack_1550 * auVar70._4_4_ +
               local_1578._4_4_ * auVar85._4_4_ + local_1568._4_4_ * auVar42._4_4_;
          auVar43._8_4_ =
               fStack_1550 * auVar70._8_4_ +
               local_1578._4_4_ * auVar85._8_4_ + local_1568._4_4_ * auVar42._8_4_;
          auVar43._12_4_ =
               fStack_1550 * auVar70._12_4_ +
               local_1578._4_4_ * auVar85._12_4_ + local_1568._4_4_ * auVar42._12_4_;
          local_13c8._0_4_ = auVar43._0_4_ + local_1438._0_4_ + local_13d8._0_4_;
          local_13c8._4_4_ = auVar43._4_4_ + local_1438._4_4_ + local_13d8._4_4_;
          local_13c8._8_4_ = auVar43._8_4_ + local_1438._8_4_ + local_13d8._8_4_;
          local_13c8._12_4_ = auVar43._12_4_ + local_1438._12_4_ + local_13d8._12_4_;
          auVar70 = vminps_avx(local_1438,local_13d8);
          auVar70 = vminps_avx(auVar70,auVar43);
          auVar64._8_4_ = 0x7fffffff;
          auVar64._0_8_ = 0x7fffffff7fffffff;
          auVar64._12_4_ = 0x7fffffff;
          local_1448 = vandps_avx(local_13c8,auVar64);
          auVar65._0_4_ = local_1448._0_4_ * 1.1920929e-07;
          auVar65._4_4_ = local_1448._4_4_ * 1.1920929e-07;
          auVar65._8_4_ = local_1448._8_4_ * 1.1920929e-07;
          auVar65._12_4_ = local_1448._12_4_ * 1.1920929e-07;
          uVar24 = CONCAT44(auVar65._4_4_,auVar65._0_4_);
          auVar89._0_8_ = uVar24 ^ 0x8000000080000000;
          auVar89._8_4_ = -auVar65._8_4_;
          auVar89._12_4_ = -auVar65._12_4_;
          auVar70 = vcmpps_avx(auVar70,auVar89,5);
          auVar85 = vmaxps_avx(local_1438,local_13d8);
          auVar85 = vmaxps_avx(auVar85,auVar43);
          auVar85 = vcmpps_avx(auVar85,auVar65,2);
          local_1458 = vorps_avx(auVar70,auVar85);
          local_157d = 0;
          auVar70 = local_1468 & local_1458;
          if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar70[0xf] < '\0') {
            auVar44._0_4_ = fVar130 * fVar52;
            auVar44._4_4_ = fVar133 * fVar58;
            auVar44._8_4_ = fVar134 * fVar39;
            auVar44._12_4_ = fVar135 * fVar40;
            auVar54._0_4_ = fVar146 * fVar120;
            auVar54._4_4_ = fVar147 * fVar122;
            auVar54._8_4_ = fVar148 * fVar123;
            auVar54._12_4_ = fVar149 * fVar124;
            auVar42 = vsubps_avx(auVar54,auVar44);
            auVar66._0_4_ = fVar120 * fVar125;
            auVar66._4_4_ = fVar122 * fVar127;
            auVar66._8_4_ = fVar123 * fVar128;
            auVar66._12_4_ = fVar124 * fVar129;
            auVar90._0_4_ = fVar130 * fVar74;
            auVar90._4_4_ = fVar133 * fVar80;
            auVar90._8_4_ = fVar134 * fVar82;
            auVar90._12_4_ = fVar135 * fVar84;
            auVar86 = vsubps_avx(auVar90,auVar66);
            auVar70 = vandps_avx(auVar64,auVar44);
            auVar85 = vandps_avx(auVar64,auVar66);
            auVar70 = vcmpps_avx(auVar70,auVar85,1);
            local_1368 = vblendvps_avx(auVar86,auVar42,auVar70);
            auVar45._0_4_ = fVar137 * fVar74;
            auVar45._4_4_ = fVar141 * fVar80;
            auVar45._8_4_ = fVar143 * fVar82;
            auVar45._12_4_ = fVar145 * fVar84;
            auVar55._0_4_ = fVar137 * fVar52;
            auVar55._4_4_ = fVar141 * fVar58;
            auVar55._8_4_ = fVar143 * fVar39;
            auVar55._12_4_ = fVar145 * fVar40;
            auVar67._0_4_ = fVar120 * fVar136;
            auVar67._4_4_ = fVar122 * fVar140;
            auVar67._8_4_ = fVar123 * fVar142;
            auVar67._12_4_ = fVar124 * fVar144;
            auVar42 = vsubps_avx(auVar55,auVar67);
            auVar92._0_4_ = fVar120 * fVar41;
            auVar92._4_4_ = fVar122 * fVar49;
            auVar92._8_4_ = fVar123 * fVar50;
            auVar92._12_4_ = fVar124 * fVar51;
            auVar86 = vsubps_avx(auVar92,auVar45);
            auVar70 = vandps_avx(auVar64,auVar67);
            auVar85 = vandps_avx(auVar64,auVar45);
            auVar70 = vcmpps_avx(auVar70,auVar85,1);
            local_1358 = vblendvps_avx(auVar86,auVar42,auVar70);
            auVar36._0_4_ = fVar130 * fVar41;
            auVar36._4_4_ = fVar133 * fVar49;
            auVar36._8_4_ = fVar134 * fVar50;
            auVar36._12_4_ = fVar135 * fVar51;
            auVar56._0_4_ = fVar130 * fVar136;
            auVar56._4_4_ = fVar133 * fVar140;
            auVar56._8_4_ = fVar134 * fVar142;
            auVar56._12_4_ = fVar135 * fVar144;
            auVar68._0_4_ = fVar146 * fVar137;
            auVar68._4_4_ = fVar147 * fVar141;
            auVar68._8_4_ = fVar148 * fVar143;
            auVar68._12_4_ = fVar149 * fVar145;
            auVar93._0_4_ = fVar137 * fVar125;
            auVar93._4_4_ = fVar141 * fVar127;
            auVar93._8_4_ = fVar143 * fVar128;
            auVar93._12_4_ = fVar145 * fVar129;
            auVar42 = vsubps_avx(auVar56,auVar68);
            auVar86 = vsubps_avx(auVar93,auVar36);
            auVar70 = vandps_avx(auVar64,auVar68);
            auVar85 = vandps_avx(auVar64,auVar36);
            auVar70 = vcmpps_avx(auVar70,auVar85,1);
            local_1348 = vblendvps_avx(auVar86,auVar42,auVar70);
            fVar52 = local_1368._0_4_ * fStack_1550 +
                     local_1358._0_4_ * local_1578._4_4_ + local_1348._0_4_ * local_1568._4_4_;
            fVar41 = local_1368._4_4_ * fStack_1550 +
                     local_1358._4_4_ * local_1578._4_4_ + local_1348._4_4_ * local_1568._4_4_;
            fVar58 = local_1368._8_4_ * fStack_1550 +
                     local_1358._8_4_ * local_1578._4_4_ + local_1348._8_4_ * local_1568._4_4_;
            fVar49 = local_1368._12_4_ * fStack_1550 +
                     local_1358._12_4_ * local_1578._4_4_ + local_1348._12_4_ * local_1568._4_4_;
            auVar69._0_4_ = fVar52 + fVar52;
            auVar69._4_4_ = fVar41 + fVar41;
            auVar69._8_4_ = fVar58 + fVar58;
            auVar69._12_4_ = fVar49 + fVar49;
            fVar52 = local_1368._0_4_ * fVar11 +
                     local_1358._0_4_ * fVar2 + local_1348._0_4_ * fVar115;
            fVar41 = local_1368._4_4_ * fVar13 +
                     local_1358._4_4_ * fVar12 + local_1348._4_4_ * fVar117;
            fVar59 = local_1368._8_4_ * fVar60 +
                     local_1358._8_4_ * fVar59 + local_1348._8_4_ * fVar118;
            fVar60 = local_1368._12_4_ * fVar15 +
                     local_1358._12_4_ * fVar14 + local_1348._12_4_ * fVar119;
            auVar70 = vrcpps_avx(auVar69);
            fVar2 = auVar70._0_4_;
            auVar99._0_4_ = auVar69._0_4_ * fVar2;
            fVar11 = auVar70._4_4_;
            auVar99._4_4_ = auVar69._4_4_ * fVar11;
            fVar12 = auVar70._8_4_;
            auVar99._8_4_ = auVar69._8_4_ * fVar12;
            fVar13 = auVar70._12_4_;
            auVar99._12_4_ = auVar69._12_4_ * fVar13;
            auVar106._8_4_ = 0x3f800000;
            auVar106._0_8_ = 0x3f8000003f800000;
            auVar106._12_4_ = 0x3f800000;
            auVar70 = vsubps_avx(auVar106,auVar99);
            local_1378._0_4_ = (fVar52 + fVar52) * (fVar2 + fVar2 * auVar70._0_4_);
            local_1378._4_4_ = (fVar41 + fVar41) * (fVar11 + fVar11 * auVar70._4_4_);
            local_1378._8_4_ = (fVar59 + fVar59) * (fVar12 + fVar12 * auVar70._8_4_);
            local_1378._12_4_ = (fVar60 + fVar60) * (fVar13 + fVar13 * auVar70._12_4_);
            uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
            auVar94._4_4_ = uVar3;
            auVar94._0_4_ = uVar3;
            auVar94._8_4_ = uVar3;
            auVar94._12_4_ = uVar3;
            auVar70 = vcmpps_avx(auVar94,local_1378,2);
            fVar2 = ray->tfar;
            auVar100._4_4_ = fVar2;
            auVar100._0_4_ = fVar2;
            auVar100._8_4_ = fVar2;
            auVar100._12_4_ = fVar2;
            auVar85 = vcmpps_avx(local_1378,auVar100,2);
            auVar70 = vandps_avx(auVar70,auVar85);
            auVar85 = vcmpps_avx(auVar69,_DAT_01f45a50,4);
            auVar70 = vandps_avx(auVar85,auVar70);
            auVar85 = vpand_avx(local_1458,local_1468);
            auVar70 = vpslld_avx(auVar70,0x1f);
            auVar70 = vpsrad_avx(auVar70,0x1f);
            local_13a8 = vpand_avx(auVar70,auVar85);
            uVar23 = vmovmskps_avx(local_13a8);
            if (uVar23 != 0) {
              local_13e8 = local_1438;
              local_13b8 = &local_157d;
              auVar70 = vrcpps_avx(local_13c8);
              fVar2 = auVar70._0_4_;
              auVar46._0_4_ = local_13c8._0_4_ * fVar2;
              fVar11 = auVar70._4_4_;
              auVar46._4_4_ = local_13c8._4_4_ * fVar11;
              fVar12 = auVar70._8_4_;
              auVar46._8_4_ = local_13c8._8_4_ * fVar12;
              fVar13 = auVar70._12_4_;
              auVar46._12_4_ = local_13c8._12_4_ * fVar13;
              auVar57._8_4_ = 0x3f800000;
              auVar57._0_8_ = 0x3f8000003f800000;
              auVar57._12_4_ = 0x3f800000;
              auVar70 = vsubps_avx(auVar57,auVar46);
              auVar37._0_4_ = fVar2 + fVar2 * auVar70._0_4_;
              auVar37._4_4_ = fVar11 + fVar11 * auVar70._4_4_;
              auVar37._8_4_ = fVar12 + fVar12 * auVar70._8_4_;
              auVar37._12_4_ = fVar13 + fVar13 * auVar70._12_4_;
              auVar47._8_4_ = 0x219392ef;
              auVar47._0_8_ = 0x219392ef219392ef;
              auVar47._12_4_ = 0x219392ef;
              auVar70 = vcmpps_avx(local_1448,auVar47,5);
              auVar70 = vandps_avx(auVar70,auVar37);
              auVar48._0_4_ = local_1438._0_4_ * auVar70._0_4_;
              auVar48._4_4_ = local_1438._4_4_ * auVar70._4_4_;
              auVar48._8_4_ = local_1438._8_4_ * auVar70._8_4_;
              auVar48._12_4_ = local_1438._12_4_ * auVar70._12_4_;
              local_1398 = vminps_avx(auVar48,auVar57);
              auVar38._0_4_ = local_13d8._0_4_ * auVar70._0_4_;
              auVar38._4_4_ = local_13d8._4_4_ * auVar70._4_4_;
              auVar38._8_4_ = local_13d8._8_4_ * auVar70._8_4_;
              auVar38._12_4_ = local_13d8._12_4_ * auVar70._12_4_;
              local_1388 = vminps_avx(auVar38,auVar57);
              uVar24 = (ulong)(uVar23 & 0xff);
              local_14e0 = puVar29;
              do {
                uVar26 = 0;
                if (uVar24 != 0) {
                  for (; (uVar24 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                  }
                }
                local_14b0 = *(uint *)((long)&local_13f8 + uVar26 * 4);
                pGVar10 = (pSVar27->geometries).items[local_14b0].ptr;
                if ((pGVar10->mask & ray->mask) == 0) {
                  uVar24 = uVar24 ^ 1L << (uVar26 & 0x3f);
                }
                else {
                  local_1558 = local_1540->args;
                  if ((local_1540->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00e596b0;
                  local_1508._0_8_ = uVar24;
                  local_14f8._0_8_ = pSVar27;
                  local_1568 = uVar30;
                  local_1498.context = local_1540->user;
                  local_14c8 = *(undefined4 *)(local_1368 + uVar26 * 4);
                  local_14c4 = *(undefined4 *)(local_1358 + uVar26 * 4);
                  local_14c0 = *(undefined4 *)(local_1348 + uVar26 * 4);
                  local_14bc = *(undefined4 *)(local_1398 + uVar26 * 4);
                  local_14b8 = *(undefined4 *)(local_1388 + uVar26 * 4);
                  local_14b4 = *(undefined4 *)((long)&local_1408 + uVar26 * 4);
                  local_14ac = (local_1498.context)->instID[0];
                  local_14a8 = (local_1498.context)->instPrimID[0];
                  local_1528._0_4_ = ray->tfar;
                  local_1518._0_8_ = uVar26;
                  ray->tfar = *(float *)(local_1378 + uVar26 * 4);
                  local_157c = -1;
                  local_1498.valid = &local_157c;
                  local_1498.geometryUserPtr = pGVar10->userPtr;
                  local_1578 = ray;
                  local_1498.hit = (RTCHitN *)&local_14c8;
                  local_1498.N = 1;
                  local_1538._0_8_ = pGVar10;
                  local_1498.ray = (RTCRayN *)ray;
                  if ((pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar10->occlusionFilterN)(&local_1498), *local_1498.valid != 0)) {
                    ray = local_1578;
                    if ((local_1558->filter == (RTCFilterFunctionN)0x0) ||
                       (((local_1558->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT &&
                        ((*(byte *)(local_1538._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_00e596b0:
                      ray->tfar = -INFINITY;
                      return;
                    }
                    (*local_1558->filter)(&local_1498);
                    ray = local_1578;
                    if (*local_1498.valid != 0) goto LAB_00e596b0;
                  }
                  local_1578->tfar = (float)local_1528._0_4_;
                  uVar24 = local_1508._0_8_ ^ 1L << (local_1518._0_8_ & 0x3f);
                  pSVar27 = (Scene *)local_14f8._0_8_;
                  ray = local_1578;
                  puVar29 = local_14e0;
                  uVar30 = local_1568;
                }
              } while (uVar24 != 0);
            }
          }
          auVar101 = ZEXT3264(local_11f8);
          auVar107 = ZEXT3264(local_1218);
          auVar114 = ZEXT3264(local_1238);
          auVar116 = ZEXT3264(local_1258);
          auVar121 = ZEXT3264(local_1278);
          auVar126 = ZEXT3264(local_1298);
          auVar132 = ZEXT3264(local_12b8);
          auVar78 = ZEXT3264(local_12d8);
          auVar71 = ZEXT3264(local_12f8);
          auVar91 = ZEXT3264(local_1318);
          auVar95 = ZEXT3264(local_1338);
          context = local_1540;
        }
        goto LAB_00e58d5f;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }